

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void setup_address_for_obmc
               (MACROBLOCKD *xd,int mi_row_offset,int mi_col_offset,MB_MODE_INFO *ref_mbmi,
               build_prediction_ctxt *ctxt,int num_planes)

{
  int idx;
  int iVar1;
  scale_factors *sf_00;
  byte *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  int *in_RDI;
  int in_R9D;
  scale_factors *sf;
  RefCntBuffer *ref_buf;
  MV_REFERENCE_FRAME frame;
  macroblockd_plane *pd;
  int plane;
  int ref_mi_col;
  int ref_mi_row;
  BLOCK_SIZE ref_bsize;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff74;
  BLOCK_SIZE in_stack_ffffffffffffff7f;
  buf_2d *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  byte bVar2;
  int *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int iVar3;
  undefined3 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  
  if (*in_RCX < 3) {
    bVar2 = 3;
  }
  else {
    bVar2 = *in_RCX;
  }
  uVar4 = CONCAT13(bVar2,in_stack_ffffffffffffffc0);
  idx = *in_RDI + in_ESI;
  for (iVar3 = 0; iVar3 < in_R9D; iVar3 = iVar3 + 1) {
    in_stack_ffffffffffffffa8 = in_RDI + (long)iVar3 * 0x28c + 4;
    in_stack_ffffffffffffff60 = in_EDX;
    setup_pred_plane(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffffa8[1]),0,0
                     ,in_stack_ffffffffffffff64,(int)in_stack_ffffffffffffff90,
                     (int)in_stack_ffffffffffffff98,
                     (scale_factors *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                     (int)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  }
  bVar2 = in_RCX[0x10];
  get_ref_frame_buf((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff5f);
  sf_00 = get_ref_scale_factors_const
                    ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff5f);
  *(scale_factors **)(in_RDI + 0x7c2) = sf_00;
  iVar1 = av1_is_valid_scale(sf_00);
  if (iVar1 == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0xa7c),AOM_CODEC_UNSUP_BITSTREAM,
                       "Reference frame has invalid dimensions");
  }
  av1_setup_pre_planes
            ((MACROBLOCKD *)CONCAT44(in_R9D,uVar4),idx,
             (YV12_BUFFER_CONFIG *)CONCAT44(iVar3,in_stack_ffffffffffffffb0),
             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,
             (scale_factors *)CONCAT17(bVar2,in_stack_ffffffffffffffa0),(int)in_RDI);
  return;
}

Assistant:

static void setup_address_for_obmc(MACROBLOCKD *xd, int mi_row_offset,
                                   int mi_col_offset, MB_MODE_INFO *ref_mbmi,
                                   struct build_prediction_ctxt *ctxt,
                                   const int num_planes) {
  const BLOCK_SIZE ref_bsize = AOMMAX(BLOCK_8X8, ref_mbmi->bsize);
  const int ref_mi_row = xd->mi_row + mi_row_offset;
  const int ref_mi_col = xd->mi_col + mi_col_offset;

  for (int plane = 0; plane < num_planes; ++plane) {
    struct macroblockd_plane *const pd = &xd->plane[plane];
    setup_pred_plane(&pd->dst, ref_bsize, ctxt->tmp_buf[plane],
                     ctxt->tmp_width[plane], ctxt->tmp_height[plane],
                     ctxt->tmp_stride[plane], mi_row_offset, mi_col_offset,
                     NULL, pd->subsampling_x, pd->subsampling_y);
  }

  const MV_REFERENCE_FRAME frame = ref_mbmi->ref_frame[0];

  const RefCntBuffer *const ref_buf = get_ref_frame_buf(ctxt->cm, frame);
  const struct scale_factors *const sf =
      get_ref_scale_factors_const(ctxt->cm, frame);

  xd->block_ref_scale_factors[0] = sf;
  if (!av1_is_valid_scale(sf))
    aom_internal_error(xd->error_info, AOM_CODEC_UNSUP_BITSTREAM,
                       "Reference frame has invalid dimensions");

  av1_setup_pre_planes(xd, 0, &ref_buf->buf, ref_mi_row, ref_mi_col, sf,
                       num_planes);
}